

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_timer_set(us_timer_t *t,_func_void_us_timer_t_ptr *cb,int ms,int repeat_ms)

{
  int __ufd;
  us_poll_t *p;
  int in_ECX;
  int in_EDX;
  us_loop_t *loop;
  undefined8 in_RSI;
  us_poll_t *in_RDI;
  itimerspec timer_spec;
  us_internal_callback_t *internal_cb;
  
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  loop = (us_loop_t *)(((long)in_ECX * 1000000) % 1000000000);
  p = (us_poll_t *)(long)(in_EDX / 1000);
  __ufd = us_poll_fd(in_RDI);
  timerfd_settime(__ufd,0,(itimerspec *)&stack0xffffffffffffffc0,(itimerspec *)0x0);
  us_poll_start(p,loop,in_ECX / 1000 >> 0x1f);
  return;
}

Assistant:

void us_timer_set(struct us_timer_t *t, void (*cb)(struct us_timer_t *t), int ms, int repeat_ms) {
    struct us_internal_callback_t *internal_cb = (struct us_internal_callback_t *) t;

    internal_cb->cb = (void (*)(struct us_internal_callback_t *)) cb;

    struct itimerspec timer_spec = {
        {repeat_ms / 1000, ((long)repeat_ms * 1000000) % 1000000000},
        {ms / 1000, ((long)ms * 1000000) % 1000000000}
    };

    timerfd_settime(us_poll_fd((struct us_poll_t *) t), 0, &timer_spec, NULL);
    us_poll_start((struct us_poll_t *) t, internal_cb->loop, LIBUS_SOCKET_READABLE);
}